

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

fromBase64_helper_result
anon_unknown.dwarf_bd45c8::fromBase64_helper
          (char *input,qsizetype inputSize,char *output,Base64Options options)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  fromBase64_helper_result fVar10;
  long lVar9;
  
  if (inputSize < 1) {
    lVar3 = 0;
    iVar7 = 0;
  }
  else {
    lVar1 = inputSize + -1;
    uVar5 = 0;
    iVar4 = 0;
    lVar3 = 0;
    lVar8 = 0;
    do {
      bVar2 = input[lVar8];
      iVar7 = -0x41;
      lVar9 = lVar8;
      if ((((byte)(bVar2 + 0xbf) < 0x1a) || (iVar7 = -0x47, (byte)(bVar2 + 0x9f) < 0x1a)) ||
         (iVar7 = 4, (byte)(bVar2 - 0x30) < 10)) {
        uVar6 = iVar7 + (char)bVar2;
        if (uVar6 != 0xffffffff) {
LAB_00304031:
          uVar5 = uVar5 << 6 | uVar6;
          if (iVar4 < 2) {
            iVar4 = iVar4 + 6;
          }
          else {
            iVar4 = iVar4 + -2;
            output[lVar3] = (char)(uVar5 >> ((byte)iVar4 & 0x1f));
            lVar3 = lVar3 + 1;
            uVar5 = uVar5 & ~(-1 << ((byte)iVar4 & 0x1f));
          }
        }
      }
      else {
        if (bVar2 < 0x2f) {
          if (bVar2 == 0x2b) {
            uVar6 = 0x3e;
LAB_003040af:
            if (((uint)options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                       super_QFlagsStorage<QByteArray::Base64Option>.i & 1) == 0) goto LAB_00304031;
          }
          else if (bVar2 == 0x2d) {
            uVar6 = 0x3e;
LAB_00304099:
            if (((uint)options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                       super_QFlagsStorage<QByteArray::Base64Option>.i & 1) != 0) goto LAB_00304031;
          }
        }
        else {
          if (bVar2 == 0x2f) {
            uVar6 = 0x3f;
            goto LAB_003040af;
          }
          if (bVar2 == 0x5f) {
            uVar6 = 0x3f;
            goto LAB_00304099;
          }
        }
        if (((uint)options.super_QFlagsStorageHelper<QByteArray::Base64Option,_4>.
                   super_QFlagsStorage<QByteArray::Base64Option>.i & 4) != 0) {
          if ((bVar2 == 0x3d) && ((inputSize & 3U) == 0)) {
            lVar9 = lVar1;
            if ((lVar8 == lVar1) || ((iVar7 = 3, lVar8 == inputSize + -2 && (input[lVar1] == '='))))
            goto LAB_0030405c;
          }
          else {
            iVar7 = (bVar2 != 0x3d) + 1;
          }
          lVar3 = 0;
          goto LAB_00304103;
        }
      }
LAB_0030405c:
      lVar8 = lVar9 + 1;
    } while (lVar8 < inputSize);
    iVar7 = 0;
  }
LAB_00304103:
  fVar10.status = iVar7;
  fVar10.decodedLength = lVar3;
  fVar10._12_4_ = 0;
  return fVar10;
}

Assistant:

fromBase64_helper_result fromBase64_helper(const char *input, qsizetype inputSize,
                                           char *output /* may alias input */,
                                           QByteArray::Base64Options options)
{
    fromBase64_helper_result result{ 0, QByteArray::Base64DecodingStatus::Ok };

    unsigned int buf = 0;
    int nbits = 0;

    qsizetype offset = 0;
    for (qsizetype i = 0; i < inputSize; ++i) {
        int ch = input[i];
        int d;

        if (ch >= 'A' && ch <= 'Z') {
            d = ch - 'A';
        } else if (ch >= 'a' && ch <= 'z') {
            d = ch - 'a' + 26;
        } else if (ch >= '0' && ch <= '9') {
            d = ch - '0' + 52;
        } else if (ch == '+' && (options & QByteArray::Base64UrlEncoding) == 0) {
            d = 62;
        } else if (ch == '-' && (options & QByteArray::Base64UrlEncoding) != 0) {
            d = 62;
        } else if (ch == '/' && (options & QByteArray::Base64UrlEncoding) == 0) {
            d = 63;
        } else if (ch == '_' && (options & QByteArray::Base64UrlEncoding) != 0) {
            d = 63;
        } else {
            if (options & QByteArray::AbortOnBase64DecodingErrors) {
                if (ch == '=') {
                    // can have 1 or 2 '=' signs, in both cases padding base64Size to
                    // a multiple of 4. Any other case is illegal.
                    if ((inputSize % 4) != 0) {
                        result.status = QByteArray::Base64DecodingStatus::IllegalInputLength;
                        return result;
                    } else if ((i == inputSize - 1) ||
                        (i == inputSize - 2 && input[++i] == '=')) {
                        d = -1; // ... and exit the loop, normally
                    } else {
                        result.status = QByteArray::Base64DecodingStatus::IllegalPadding;
                        return result;
                    }
                } else {
                    result.status = QByteArray::Base64DecodingStatus::IllegalCharacter;
                    return result;
                }
            } else {
                d = -1;
            }
        }

        if (d != -1) {
            buf = (buf << 6) | d;
            nbits += 6;
            if (nbits >= 8) {
                nbits -= 8;
                Q_ASSERT(offset < i);
                output[offset++] = buf >> nbits;
                buf &= (1 << nbits) - 1;
            }
        }
    }

    result.decodedLength = offset;
    return result;
}